

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O3

StreamIn * prvTidyFileInput(TidyDocImpl *doc,FILE *fp,int encoding)

{
  TidyAllocator *pTVar1;
  int iVar2;
  StreamIn *__s;
  tchar *ptVar3;
  
  __s = (StreamIn *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x160);
  memset(__s,0,0x158);
  __s->curcol = 1;
  __s->curline = 1;
  __s->encoding = encoding;
  __s->doc = doc;
  __s->bufsize = 5;
  pTVar1 = doc->allocator;
  __s->allocator = pTVar1;
  ptVar3 = (tchar *)(*pTVar1->vtbl->alloc)(pTVar1,0x14);
  __s->charbuf = ptVar3;
  __s->curlastpos = 0;
  __s->firstlastpos = 0;
  iVar2 = prvTidyinitFileSource(doc->allocator,&__s->source,fp);
  if (iVar2 == 0) {
    __s->iotype = FileIO;
  }
  else {
    (*__s->allocator->vtbl->free)(__s->allocator,__s->charbuf);
    (*__s->allocator->vtbl->free)(__s->allocator,__s);
    __s = (StreamIn *)0x0;
  }
  return __s;
}

Assistant:

StreamIn* TY_(FileInput)( TidyDocImpl* doc, FILE *fp, int encoding )
{
    StreamIn *in = TY_(initStreamIn)( doc, encoding );
    if ( TY_(initFileSource)( doc->allocator, &in->source, fp ) != 0 )
    {
        TY_(freeStreamIn)( in );
        return NULL;
    }
    in->iotype = FileIO;
    return in;
}